

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

bool __thiscall
QColorDialogPrivate::handleColorPickingMouseButtonRelease(QColorDialogPrivate *this,QMouseEvent *e)

{
  bool bVar1;
  QColorDialogPrivate *this_00;
  long in_FS_OFFSET;
  double dVar2;
  QColor QVar3;
  undefined1 auVar4 [16];
  QPoint local_28;
  QColor local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QColorDialogPrivate **)(e + 0x30);
  auVar4 = QEventPoint::globalPosition();
  dVar2 = (double)((ulong)auVar4._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar4._0_8_;
  bVar1 = 2147483647.0 < dVar2;
  if (dVar2 <= -2147483648.0) {
    dVar2 = -2147483648.0;
  }
  local_28.xp.m_i =
       (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar2);
  dVar2 = (double)((ulong)auVar4._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar4._8_8_;
  bVar1 = 2147483647.0 < dVar2;
  if (dVar2 <= -2147483648.0) {
    dVar2 = -2147483648.0;
  }
  local_28.yp.m_i =
       (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar2);
  QVar3 = grabScreenColor(this_00,&local_28);
  local_20._0_8_ = QVar3._0_8_;
  local_20.ct._4_4_ = QVar3.ct._4_4_;
  local_20.ct.argb.pad = QVar3.ct._8_2_;
  setCurrentColor(this,&local_20,SetColorAll);
  releaseColorPicking(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QColorDialogPrivate::handleColorPickingMouseButtonRelease(QMouseEvent *e)
{
    setCurrentColor(grabScreenColor(e->globalPosition().toPoint()), SetColorAll);
    releaseColorPicking();
    return true;
}